

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O2

void __thiscall
QParallelAnimationGroup::updateState(QParallelAnimationGroup *this,State newState,State oldState)

{
  QParallelAnimationGroupPrivate *this_00;
  QAbstractAnimation **ppQVar1;
  long lVar2;
  QAbstractAnimation *this_01;
  bool bVar3;
  State SVar4;
  parameter_type direction;
  long lVar5;
  
  this_00 = *(QParallelAnimationGroupPrivate **)(this + 8);
  QAbstractAnimation::updateState((QAbstractAnimation *)this,newState,oldState);
  if (newState == Running) {
    QParallelAnimationGroupPrivate::connectUncontrolledAnimations(this_00);
    ppQVar1 = (this_00->super_QAnimationGroupPrivate).animations.d.ptr;
    lVar2 = (this_00->super_QAnimationGroupPrivate).animations.d.size;
    for (lVar5 = 0; lVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
      this_01 = *(QAbstractAnimation **)((long)ppQVar1 + lVar5);
      if (oldState == Stopped) {
        QAbstractAnimation::stop(this_01);
      }
      direction = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                  ::value(&(this_00->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                           direction);
      QAbstractAnimation::setDirection(this_01,direction);
      bVar3 = QParallelAnimationGroupPrivate::shouldAnimationStart
                        (this_00,(QAbstractAnimation *)this_01,oldState == Stopped);
      if (bVar3) {
        QAbstractAnimation::start(this_01,KeepWhenStopped);
      }
    }
  }
  else if (newState == Paused) {
    ppQVar1 = (this_00->super_QAnimationGroupPrivate).animations.d.ptr;
    lVar2 = (this_00->super_QAnimationGroupPrivate).animations.d.size;
    for (lVar5 = 0; lVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
      SVar4 = QAbstractAnimation::state(*(QAbstractAnimation **)((long)ppQVar1 + lVar5));
      if (SVar4 == Running) {
        QAbstractAnimation::pause(*(QAbstractAnimation **)((long)ppQVar1 + lVar5));
      }
    }
  }
  else if (newState == Stopped) {
    ppQVar1 = (this_00->super_QAnimationGroupPrivate).animations.d.ptr;
    lVar2 = (this_00->super_QAnimationGroupPrivate).animations.d.size;
    for (lVar5 = 0; lVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
      QAbstractAnimation::stop(*(QAbstractAnimation **)((long)ppQVar1 + lVar5));
    }
    QParallelAnimationGroupPrivate::disconnectUncontrolledAnimations(this_00);
    return;
  }
  return;
}

Assistant:

void QParallelAnimationGroup::updateState(QAbstractAnimation::State newState,
                                          QAbstractAnimation::State oldState)
{
    Q_D(QParallelAnimationGroup);
    QAnimationGroup::updateState(newState, oldState);

    switch (newState) {
    case Stopped:
        for (AnimationListConstIt it = d->animations.constBegin(), cend = d->animations.constEnd(); it != cend; ++it)
            (*it)->stop();
        d->disconnectUncontrolledAnimations();
        break;
    case Paused:
        for (AnimationListConstIt it = d->animations.constBegin(), cend = d->animations.constEnd(); it != cend; ++it) {
            if ((*it)->state() == Running)
                (*it)->pause();
        }
        break;
    case Running:
        d->connectUncontrolledAnimations();
        for (AnimationListConstIt it = d->animations.constBegin(), cend = d->animations.constEnd(); it != cend; ++it) {
            QAbstractAnimation *animation = *it;
            if (oldState == Stopped)
                animation->stop();
            animation->setDirection(d->direction);
            if (d->shouldAnimationStart(animation, oldState == Stopped))
                animation->start();
        }
        break;
    }
}